

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O0

QNetworkInformation * QNetworkInformationPrivate::create(QStringView name)

{
  long lVar1;
  QNetworkInformationBackendFactory *pQVar2;
  anon_class_16_1_898f2789_for__M_pred __pred;
  bool bVar3;
  undefined4 uVar4;
  Type *pTVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  QNetworkInformationBackendFactory **ppQVar9;
  long lVar10;
  QNetworkInformationBackend *in_RSI;
  QNetworkInformation *in_RDI;
  long in_FS_OFFSET;
  QNetworkInformationBackend *backend;
  const_iterator it;
  anon_class_16_1_898f2789_for__M_pred nameMatches;
  QMutexLocker<QMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
  *in_stack_ffffffffffffff58;
  QMutexLocker<QMutex> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  const_iterator in_stack_ffffffffffffffa8;
  pointer pQVar11;
  const_iterator local_40 [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QStringView::isEmpty((QStringView *)0x2315c9);
  if (bVar3) {
    pQVar11 = (pointer)0x0;
  }
  else {
    pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
             operator()(in_stack_ffffffffffffff58);
    if (pTVar5 == (Type *)0x0) {
      pQVar11 = (pointer)0x0;
    }
    else {
      bVar3 = initializeList();
      if (bVar3) {
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::operator->
                  ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                    *)0x23163e);
        QMutexLocker<QMutex>::QMutexLocker
                  (in_stack_ffffffffffffff60,(QMutex *)in_stack_ffffffffffffff58);
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::operator->
                  ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                    *)0x23165a);
        bVar3 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QNetworkInformation,_QNetworkInformationDeleter> *)0x231666);
        if (bVar3) {
          QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
          operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                      *)0x231678);
          pQVar11 = std::unique_ptr<QNetworkInformation,_QNetworkInformationDeleter>::get
                              ((unique_ptr<QNetworkInformation,_QNetworkInformationDeleter> *)
                               0x231684);
        }
        else {
          local_40[0].i = (QNetworkInformationBackendFactory **)0xaaaaaaaaaaaaaaaa;
          QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
          operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                      *)0x2316e0);
          cVar6 = QList<QNetworkInformationBackendFactory_*>::cbegin
                            ((QList<QNetworkInformationBackendFactory_*> *)in_stack_ffffffffffffff60
                            );
          QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
          operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                      *)0x2316fd);
          cVar7 = QList<QNetworkInformationBackendFactory_*>::cend
                            ((QList<QNetworkInformationBackendFactory_*> *)in_stack_ffffffffffffff60
                            );
          cVar8.i._4_4_ = in_stack_ffffffffffffffa4;
          cVar8.i._0_4_ = in_stack_ffffffffffffffa0;
          __pred.name.m_data = (storage_type_conflict *)cVar6.i;
          __pred.name.m_size = (qsizetype)cVar7.i;
          local_40[0] = std::
                        find_if<QList<QNetworkInformationBackendFactory*>::const_iterator,QNetworkInformationPrivate::create(QStringView)::__0>
                                  (in_stack_ffffffffffffffa8,cVar8,__pred);
          QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
          operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                      *)0x23174c);
          cVar8 = QList<QNetworkInformationBackendFactory_*>::cend
                            ((QList<QNetworkInformationBackendFactory_*> *)in_stack_ffffffffffffff60
                            );
          bVar3 = QList<QNetworkInformationBackendFactory_*>::const_iterator::operator==
                            (local_40,cVar8);
          if (bVar3) {
            pQVar11 = (pointer)0x0;
          }
          else {
            ppQVar9 = QList<QNetworkInformationBackendFactory_*>::const_iterator::operator*
                                (local_40);
            pQVar2 = *ppQVar9;
            ppQVar9 = QList<QNetworkInformationBackendFactory_*>::const_iterator::operator*
                                (local_40);
            uVar4 = (**(code **)(*(long *)*ppQVar9 + 0x70))();
            lVar10 = (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,uVar4);
            if (lVar10 == 0) {
              pQVar11 = (pointer)0x0;
            }
            else {
              pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                       ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                                     *)0x2317ec);
              in_stack_ffffffffffffff60 = (QMutexLocker<QMutex> *)&pTVar5->instanceHolder;
              operator_new(0x10);
              QNetworkInformation::QNetworkInformation(in_RDI,in_RSI);
              std::unique_ptr<QNetworkInformation,_QNetworkInformationDeleter>::reset
                        ((unique_ptr<QNetworkInformation,_QNetworkInformationDeleter> *)
                         in_stack_ffffffffffffff60,(pointer)in_stack_ffffffffffffff58);
              QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
              operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                          *)0x23182c);
              pQVar11 = std::unique_ptr<QNetworkInformation,_QNetworkInformationDeleter>::get
                                  ((unique_ptr<QNetworkInformation,_QNetworkInformationDeleter> *)
                                   0x231838);
            }
          }
        }
        QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffff60);
      }
      else {
        pQVar11 = (pointer)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar11;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkInformation *QNetworkInformationPrivate::create(QStringView name)
{
    if (name.isEmpty())
        return nullptr;
    if (!dataHolder())
        return nullptr;
#ifdef DEBUG_LOADING
    qDebug().nospace() << "create() called with name=\"" << name
                       << "\". instanceHolder initialized? " << !!dataHolder->instanceHolder;
#endif
    if (!initializeList()) {
#ifdef DEBUG_LOADING
        qDebug("Failed to initialize list, returning.");
#endif
        return nullptr;
    }

    QMutexLocker locker(&dataHolder->instanceMutex);
    if (dataHolder->instanceHolder)
        return dataHolder->instanceHolder.get();


    const auto nameMatches = [name](QNetworkInformationBackendFactory *factory) {
        return factory->name().compare(name, Qt::CaseInsensitive) == 0;
    };
    auto it = std::find_if(dataHolder->factories.cbegin(), dataHolder->factories.cend(),
                            nameMatches);
    if (it == dataHolder->factories.cend()) {
#ifdef DEBUG_LOADING
        if (dataHolder->factories.isEmpty()) {
            qDebug("No plugins available");
        } else {
            QString listNames;
            listNames.reserve(8 * dataHolder->factories.count());
            for (const auto *factory : std::as_const(dataHolder->factories))
                listNames += factory->name() + ", "_L1;
            listNames.chop(2);
            qDebug().nospace() << "Couldn't find " << name << " in list with names: { "
                                << listNames << " }";
        }
#endif
        return nullptr;
    }
#ifdef DEBUG_LOADING
    qDebug() << "Creating instance using loader named " << (*it)->name();
#endif
    QNetworkInformationBackend *backend = (*it)->create((*it)->featuresSupported());
    if (!backend)
        return nullptr;
    dataHolder->instanceHolder.reset(new QNetworkInformation(backend));
    Q_ASSERT(name.isEmpty()
             || dataHolder->instanceHolder->backendName().compare(name, Qt::CaseInsensitive) == 0);
    return dataHolder->instanceHolder.get();
}